

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dgSmallDeterminant.cpp
# Opt level: O1

HaF64 Determinant4x4(HaF64 (*matrix) [4],HaF64 *error)

{
  HaF64 HVar1;
  undefined1 auVar2 [16];
  undefined8 uVar3;
  bool bVar4;
  HaF64 (*paHVar5) [4];
  HaI32 j;
  long lVar6;
  HaI32 k;
  long lVar7;
  int iVar8;
  HaI32 i;
  long lVar9;
  undefined1 auVar10 [16];
  HaF64 HVar11;
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  HaF64 parcialError;
  HaF64 cofactor [3] [3];
  HaF64 local_a0;
  ulong local_98;
  ulong uStack_90;
  double local_88;
  ulong uStack_80;
  HaF64 local_78 [10];
  
  auVar14 = ZEXT816(0) << 0x40;
  local_88 = 1.0;
  uStack_80 = 0;
  lVar9 = 0;
  local_98 = 0x8000000000000000;
  uStack_90 = 0x8000000000000000;
  auVar12 = ZEXT816(0) << 0x40;
  do {
    lVar6 = 0;
    paHVar5 = matrix;
    do {
      lVar7 = 0;
      iVar8 = 0;
      do {
        if (lVar9 != lVar7) {
          local_78[lVar6 * 3 + (long)iVar8] = (*paHVar5)[lVar7];
          iVar8 = iVar8 + 1;
        }
        lVar7 = lVar7 + 1;
      } while (lVar7 != 4);
      lVar6 = lVar6 + 1;
      paHVar5 = paHVar5 + 1;
    } while (lVar6 != 3);
    HVar11 = Determinant3x3((HaF64 (*) [3])local_78,&local_a0);
    HVar1 = matrix[3][lVar9];
    auVar13._8_8_ = 0;
    auVar13._0_8_ = HVar1;
    auVar15._0_8_ = (ulong)HVar1 ^ local_98;
    auVar15._8_8_ = uStack_90;
    uVar3 = vcmpsd_avx512f(auVar15,auVar13,6);
    bVar4 = (bool)((byte)uVar3 & 1);
    auVar12._8_8_ = 0;
    auVar16._8_8_ = 0;
    auVar16._0_8_ = local_88 * (double)HVar11;
    auVar12 = vfmadd231sd_fma(auVar12,auVar13,auVar16);
    auVar10._0_8_ = bVar4 * auVar15._0_8_ + (ulong)!bVar4 * (long)HVar1;
    auVar10._8_8_ = 0;
    auVar14._8_8_ = 0;
    auVar2._8_8_ = 0;
    auVar2._0_8_ = local_a0;
    auVar14 = vfmadd231sd_fma(auVar14,auVar10,auVar2);
    local_88 = (double)((ulong)local_88 ^ local_98);
    uStack_80 = uStack_80 ^ uStack_90;
    lVar9 = lVar9 + 1;
  } while (lVar9 != 4);
  *error = auVar14._0_8_;
  return auVar12._0_8_;
}

Assistant:

hacd::HaF64 Determinant4x4 (const hacd::HaF64 matrix[4][4], hacd::HaF64* const error)
{
	hacd::HaF64 sign = hacd::HaF64 (1.0f);
	hacd::HaF64 det = hacd::HaF64 (0.0f);
	hacd::HaF64 accError = hacd::HaF64 (0.0f); 
	for (hacd::HaI32 i = 0; i < 4; i ++)  {
		hacd::HaF64 cofactor[3][3];
		for (hacd::HaI32 j = 0; j < 3; j ++) {
			hacd::HaI32 k0 = 0;
			for (hacd::HaI32 k = 0; k < 4; k ++) {
				if (k != i) {
					cofactor[j][k0] = matrix[j][k];
					k0 ++;
				}
			}
		}

		hacd::HaF64 parcialError;
		hacd::HaF64 minorDet = Determinant3x3 (cofactor, &parcialError);
		accError +=  parcialError * Absolute (matrix[3][i]);
		det += sign * minorDet * matrix[3][i];
		sign *= hacd::HaF64 (-1.0f);
	}

	*error = accError;
	return det;
}